

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transfer.c
# Opt level: O2

CURLcode Curl_pretransfer(Curl_easy *data)

{
  undefined1 *puVar1;
  unsigned_long *puVar2;
  undefined4 uVar3;
  Curl_HttpReq CVar4;
  char *pcVar5;
  CURLU *u;
  size_t amount;
  undefined8 uVar6;
  unsigned_long uVar7;
  long lVar8;
  ulong uVar9;
  CURLUcode CVar10;
  CURLcode CVar11;
  CURLcode CVar12;
  size_t sVar13;
  
  pcVar5 = (data->change).url;
  if (pcVar5 == (char *)0x0) {
    if ((data->set).uh == (CURLU *)0x0) goto LAB_00122e3a;
    if (((data->change).field_0x20 & 1) != 0) goto LAB_00122e02;
LAB_00122e1a:
    u = (data->set).uh;
    if ((u != (CURLU *)0x0) &&
       (CVar10 = curl_url_get(u,CURLUPART_URL,(data->set).str + 0x19,0), CVar10 != CURLUE_OK)) {
LAB_00122e3a:
      Curl_failf(data,"No URL set!");
      return CURLE_URL_MALFORMAT;
    }
  }
  else if (((data->change).field_0x20 & 1) != 0) {
LAB_00122e02:
    (*Curl_cfree)(pcVar5);
    (data->change).url = (char *)0x0;
    puVar1 = &(data->change).field_0x20;
    *puVar1 = *puVar1 & 0xfe;
    goto LAB_00122e1a;
  }
  amount = (data->set).general_ssl.max_ssl_sessions;
  (data->change).url = (data->set).str[0x19];
  CVar11 = Curl_ssl_initsessions(data,amount);
  if (CVar11 != CURLE_OK) {
    return CVar11;
  }
  uVar6 = *(undefined8 *)&(data->set).field_0x888;
  uVar3 = *(undefined4 *)&(data->state).field_0x4e4;
  (data->set).followlocation = 0;
  (data->state).httpversion = 0;
  *(ushort *)&(data->state).field_0x4e4 =
       (ushort)uVar3 & 0xff55 | (ushort)(uint)((ulong)uVar6 >> 0x23) & 0x80;
  uVar7 = (data->set).proxyauth;
  (data->state).authhost.want = (data->set).httpauth;
  (data->state).authproxy.want = uVar7;
  (*Curl_cfree)((data->info).wouldredirect);
  (data->info).wouldredirect = (char *)0x0;
  CVar4 = (data->set).httpreq;
  if ((CVar4 == HTTPREQ_GET) || (CVar4 == HTTPREQ_HEAD)) {
    (data->state).infilesize = 0;
  }
  else {
    if (CVar4 == HTTPREQ_PUT) {
      sVar13 = (data->set).filesize;
    }
    else {
      pcVar5 = (char *)(data->set).postfields;
      lVar8 = (data->set).postfieldsize;
      (data->state).infilesize = lVar8;
      if (lVar8 != -1 || pcVar5 == (char *)0x0) goto LAB_00122f3f;
      sVar13 = strlen(pcVar5);
    }
    (data->state).infilesize = sVar13;
  }
LAB_00122f3f:
  if ((data->change).cookielist != (curl_slist *)0x0) {
    Curl_cookie_loadfiles(data);
  }
  if (((data->change).resolve == (curl_slist *)0x0) ||
     (CVar11 = Curl_loadhostpairs(data), CVar11 == CURLE_OK)) {
    puVar1 = &(data->state).field_0x4e4;
    *puVar1 = *puVar1 | 0x10;
    Curl_initinfo(data);
    Curl_pgrsResetTransferSizes(data);
    Curl_pgrsStartNow(data);
    uVar9 = (data->state).authproxy.want;
    puVar2 = &(data->state).authhost.picked;
    *puVar2 = *puVar2 & (data->state).authhost.want;
    puVar2 = &(data->state).authproxy.picked;
    *puVar2 = *puVar2 & uVar9;
    CVar11 = CURLE_OK;
    if ((((data->state).field_0x4e4 & 0x80) != 0) &&
       (((data->wildcard).state == CURLWC_CLEAR &&
        (CVar12 = Curl_wildcard_init(&data->wildcard), CVar12 != CURLE_OK)))) {
      CVar11 = CURLE_OUT_OF_MEMORY;
    }
  }
  return CVar11;
}

Assistant:

CURLcode Curl_pretransfer(struct Curl_easy *data)
{
  CURLcode result;

  if(!data->change.url && !data->set.uh) {
    /* we can't do anything without URL */
    failf(data, "No URL set!");
    return CURLE_URL_MALFORMAT;
  }

  /* since the URL may have been redirected in a previous use of this handle */
  if(data->change.url_alloc) {
    /* the already set URL is allocated, free it first! */
    Curl_safefree(data->change.url);
    data->change.url_alloc = FALSE;
  }

  if(!data->change.url && data->set.uh) {
    CURLUcode uc;
    uc = curl_url_get(data->set.uh,
                        CURLUPART_URL, &data->set.str[STRING_SET_URL], 0);
    if(uc) {
      failf(data, "No URL set!");
      return CURLE_URL_MALFORMAT;
    }
  }

  data->change.url = data->set.str[STRING_SET_URL];

  /* Init the SSL session ID cache here. We do it here since we want to do it
     after the *_setopt() calls (that could specify the size of the cache) but
     before any transfer takes place. */
  result = Curl_ssl_initsessions(data, data->set.general_ssl.max_ssl_sessions);
  if(result)
    return result;

  data->state.wildcardmatch = data->set.wildcard_enabled;
  data->set.followlocation = 0; /* reset the location-follow counter */
  data->state.this_is_a_follow = FALSE; /* reset this */
  data->state.errorbuf = FALSE; /* no error has occurred */
  data->state.httpversion = 0; /* don't assume any particular server version */

  data->state.authproblem = FALSE;
  data->state.authhost.want = data->set.httpauth;
  data->state.authproxy.want = data->set.proxyauth;
  Curl_safefree(data->info.wouldredirect);
  data->info.wouldredirect = NULL;

  if(data->set.httpreq == HTTPREQ_PUT)
    data->state.infilesize = data->set.filesize;
  else if((data->set.httpreq != HTTPREQ_GET) &&
          (data->set.httpreq != HTTPREQ_HEAD)) {
    data->state.infilesize = data->set.postfieldsize;
    if(data->set.postfields && (data->state.infilesize == -1))
      data->state.infilesize = (curl_off_t)strlen(data->set.postfields);
  }
  else
    data->state.infilesize = 0;

  /* If there is a list of cookie files to read, do it now! */
  if(data->change.cookielist)
    Curl_cookie_loadfiles(data);

  /* If there is a list of host pairs to deal with */
  if(data->change.resolve)
    result = Curl_loadhostpairs(data);

  if(!result) {
    /* Allow data->set.use_port to set which port to use. This needs to be
     * disabled for example when we follow Location: headers to URLs using
     * different ports! */
    data->state.allow_port = TRUE;

#if defined(HAVE_SIGNAL) && defined(SIGPIPE) && !defined(HAVE_MSG_NOSIGNAL)
    /*************************************************************
     * Tell signal handler to ignore SIGPIPE
     *************************************************************/
    if(!data->set.no_signal)
      data->state.prev_signal = signal(SIGPIPE, SIG_IGN);
#endif

    Curl_initinfo(data); /* reset session-specific information "variables" */
    Curl_pgrsResetTransferSizes(data);
    Curl_pgrsStartNow(data);

    /* In case the handle is re-used and an authentication method was picked
       in the session we need to make sure we only use the one(s) we now
       consider to be fine */
    data->state.authhost.picked &= data->state.authhost.want;
    data->state.authproxy.picked &= data->state.authproxy.want;

#ifndef CURL_DISABLE_FTP
    if(data->state.wildcardmatch) {
      struct WildcardData *wc = &data->wildcard;
      if(wc->state < CURLWC_INIT) {
        result = Curl_wildcard_init(wc); /* init wildcard structures */
        if(result)
          return CURLE_OUT_OF_MEMORY;
      }
    }
#endif
  }

  return result;
}